

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

bool cmState::StringToCacheEntryType(string *s,CacheEntryType *type)

{
  __type _Var1;
  size_type sVar2;
  const_reference __rhs;
  ulong local_28;
  size_t i;
  CacheEntryType *type_local;
  string *s_local;
  
  local_28 = 0;
  while( true ) {
    sVar2 = std::
            array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
            ::size(&cmCacheEntryTypes_abi_cxx11_);
    if (sVar2 <= local_28) {
      return false;
    }
    __rhs = std::
            array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
            ::operator[](&cmCacheEntryTypes_abi_cxx11_,local_28);
    _Var1 = std::operator==(s,__rhs);
    if (_Var1) break;
    local_28 = local_28 + 1;
  }
  *type = (CacheEntryType)local_28;
  return true;
}

Assistant:

bool cmState::StringToCacheEntryType(const std::string& s,
                                     cmStateEnums::CacheEntryType& type)
{
  for (size_t i = 0; i < cmCacheEntryTypes.size(); ++i) {
    if (s == cmCacheEntryTypes[i]) {
      type = static_cast<cmStateEnums::CacheEntryType>(i);
      return true;
    }
  }
  return false;
}